

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O2

enumeration
trial::dynamic::convert::
into<enum_class_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
          (basic_variable<std::allocator<char>_> *u)

{
  enumeration eVar1;
  error *this;
  error_code ec;
  error_code error;
  
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  eVar1 = detail::overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_void>::
          convert(u,&error);
  if (error._M_value == 0) {
    return eVar1;
  }
  this = (error *)__cxa_allocate_exception(0x20);
  ec._4_4_ = 0;
  ec._M_value = error._M_value;
  ec._M_cat = error._M_cat;
  dynamic::error::error(this,ec);
  __cxa_throw(this,&dynamic::error::typeinfo,std::system_error::~system_error);
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}